

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFParser.cpp
# Opt level: O0

bool __thiscall PDFParser::ReadNextBufferFromEnd(PDFParser *this)

{
  LongFilePositionType LVar1;
  LongFilePositionType LVar2;
  ulong local_30;
  LongBufferSizeType readAmount;
  LongFilePositionType positionAfter;
  LongFilePositionType positionBefore;
  PDFParser *this_local;
  
  if ((this->mEncounteredFileStart & 1U) == 0) {
    InputOffsetStream::SetPositionFromEnd(&this->mStream,this->mLastReadPositionFromEnd);
    LVar1 = InputOffsetStream::GetCurrentPosition(&this->mStream);
    InputOffsetStream::SetPositionFromEnd(&this->mStream,this->mLastReadPositionFromEnd + 0x400);
    LVar2 = InputOffsetStream::GetCurrentPosition(&this->mStream);
    local_30 = LVar1 - LVar2;
    if (local_30 != 0) {
      local_30 = InputOffsetStream::Read(&this->mStream,this->mLinesBuffer,local_30);
    }
    this->mEncounteredFileStart = local_30 < 0x400;
    if (local_30 == 0) {
      this_local._7_1_ = false;
    }
    else {
      this->mLastAvailableIndex = this->mLinesBuffer + local_30;
      this->mCurrentBufferIndex = this->mLastAvailableIndex;
      this->mLastReadPositionFromEnd = local_30 + this->mLastReadPositionFromEnd;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool PDFParser::ReadNextBufferFromEnd()
{
	if(mEncounteredFileStart)
	{
		return false;
	}
	else
	{
		mStream.SetPositionFromEnd(mLastReadPositionFromEnd); // last known position that worked.
		LongFilePositionType positionBefore = mStream.GetCurrentPosition();
		mStream.SetPositionFromEnd(mLastReadPositionFromEnd + LINE_BUFFER_SIZE); // try earlier one
		LongFilePositionType positionAfter = mStream.GetCurrentPosition();
		LongBufferSizeType readAmount = positionBefore - positionAfter; // check if got to start by testing position
		if(readAmount != 0)
			readAmount = mStream.Read(mLinesBuffer,readAmount);
		mEncounteredFileStart = readAmount < LINE_BUFFER_SIZE;
		if(0 == readAmount)
			return false;
		mLastAvailableIndex = mLinesBuffer + readAmount;
		mCurrentBufferIndex = mLastAvailableIndex;
		mLastReadPositionFromEnd+= readAmount;
		return true;
	}
}